

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpxWrapper.cpp
# Opt level: O0

void reportSolveData(HighsLogOptions *log_options,Info *ipx_info)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint *in_RSI;
  HighsLogOptions *in_RDI;
  double sum_time;
  
  highsLogDev(in_RDI,kInfo,"\nIPX Solve data\n");
  highsLogDev(in_RDI,kInfo,"    IPX       status = %4d\n",(ulong)*in_RSI);
  highsLogDev(in_RDI,kInfo,"    IPM       status = %4d\n",(ulong)in_RSI[1]);
  highsLogDev(in_RDI,kInfo,"    Crossover status = %4d\n",(ulong)in_RSI[2]);
  highsLogDev(in_RDI,kInfo,"    IPX errflag      = %4d\n\n",(ulong)in_RSI[3]);
  highsLogDev(in_RDI,kInfo,"    LP variables   = %8d\n",(ulong)in_RSI[4]);
  highsLogDev(in_RDI,kInfo,"    LP constraints = %8d\n",(ulong)in_RSI[5]);
  highsLogDev(in_RDI,kInfo,"    LP entries     = %8d\n\n",(ulong)in_RSI[6]);
  highsLogDev(in_RDI,kInfo,"    Solver columns = %8d\n",(ulong)in_RSI[8]);
  highsLogDev(in_RDI,kInfo,"    Solver rows    = %8d\n",(ulong)in_RSI[7]);
  highsLogDev(in_RDI,kInfo,"    Solver entries = %8d\n\n",(ulong)in_RSI[9]);
  highsLogDev(in_RDI,kInfo,"    Dualized = %d\n",(ulong)in_RSI[10]);
  highsLogDev(in_RDI,kInfo,"    Number of dense columns detected = %d\n\n",(ulong)in_RSI[0xb]);
  highsLogDev(in_RDI,kInfo,"    Dependent rows    = %d\n",(ulong)in_RSI[0xe]);
  highsLogDev(in_RDI,kInfo,"    Dependent cols    = %d\n",(ulong)in_RSI[0xf]);
  highsLogDev(in_RDI,kInfo,"    Inconsistent rows = %d\n",(ulong)in_RSI[0x10]);
  highsLogDev(in_RDI,kInfo,"    Inconsistent cols = %d\n",(ulong)in_RSI[0x11]);
  highsLogDev(in_RDI,kInfo,"    Primal dropped    = %d\n",(ulong)in_RSI[0x12]);
  highsLogDev(in_RDI,kInfo,"    Dual   dropped    = %d\n\n",(ulong)in_RSI[0x13]);
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x14),(HighsLogType)in_RDI,(char *)0x1,
              "    |Absolute primal residual| = %11.4g\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x16),(HighsLogType)in_RDI,(char *)0x1,
              "    |Absolute   dual residual| = %11.4g\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x18),(HighsLogType)in_RDI,(char *)0x1,
              "    |Relative primal residual| = %11.4g\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x1a),(HighsLogType)in_RDI,(char *)0x1,
              "    |Relative   dual residual| = %11.4g\n\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x1c),(HighsLogType)in_RDI,(char *)0x1,
              "    Primal objective value     = %11.4g\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x1e),(HighsLogType)in_RDI,(char *)0x1,
              "    Dual   objective value     = %11.4g\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x20),(HighsLogType)in_RDI,(char *)0x1,
              "    Relative objective gap     = %11.4g\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x22),(HighsLogType)in_RDI,(char *)0x1,
              "    Complementarity            = %11.4g\n\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x24),(HighsLogType)in_RDI,(char *)0x1,
              "    |x| = %11.4g\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x26),(HighsLogType)in_RDI,(char *)0x1,
              "    |y| = %11.4g\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x28),(HighsLogType)in_RDI,(char *)0x1,
              "    |z| = %11.4g\n\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x2a),(HighsLogType)in_RDI,(char *)0x1,
              "    Objective value       = %11.4g\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x2c),(HighsLogType)in_RDI,(char *)0x1,
              "    Primal infeasibility = %11.4g\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x2e),(HighsLogType)in_RDI,(char *)0x1,
              "    Dual infeasibility   = %11.4g\n\n");
  highsLogDev(in_RDI,kInfo,"    IPM iter   = %d\n",(ulong)in_RSI[0x30]);
  highsLogDev(in_RDI,kInfo,"    KKT iter 1 = %d\n",(ulong)in_RSI[0x31]);
  highsLogDev(in_RDI,kInfo,"    KKT iter 2 = %d\n",(ulong)in_RSI[0x32]);
  highsLogDev(in_RDI,kInfo,"    Basis repairs = %d\n",(ulong)in_RSI[0x33]);
  highsLogDev(in_RDI,kInfo,"    Updates start     = %d\n",(ulong)in_RSI[0x34]);
  highsLogDev(in_RDI,kInfo,"    Updates ipm       = %d\n",(ulong)in_RSI[0x35]);
  highsLogDev(in_RDI,kInfo,"    Updates crossover = %d\n\n",(ulong)in_RSI[0x36]);
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x38),(HighsLogType)in_RDI,(char *)0x1,
              "    Time total          = %8.2f\n\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x3a),(HighsLogType)in_RDI,(char *)0x1,
              "    Time IPM 1          = %8.2f\n");
  dVar1 = *(double *)(in_RSI + 0x3a);
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x3c),(HighsLogType)in_RDI,(char *)0x1,
              "    Time IPM 2          = %8.2f\n");
  dVar2 = *(double *)(in_RSI + 0x3c);
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x3e),(HighsLogType)in_RDI,(char *)0x1,
              "    Time starting basis = %8.2f\n");
  dVar3 = *(double *)(in_RSI + 0x3e);
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x40),(HighsLogType)in_RDI,(char *)0x1,
              "    Time crossover      = %8.2f\n");
  highsLogDev((HighsLogOptions *)(dVar3 + dVar2 + dVar1 + 0.0),(HighsLogType)in_RDI,(char *)0x1,
              "    Sum                 = %8.2f\n\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x42),(HighsLogType)in_RDI,(char *)0x1,
              "    Time kkt_factorize  = %8.2f\n");
  dVar1 = *(double *)(in_RSI + 0x42);
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x44),(HighsLogType)in_RDI,(char *)0x1,
              "    Time kkt_solve      = %8.2f\n");
  highsLogDev((HighsLogOptions *)(*(double *)(in_RSI + 0x44) + dVar1 + 0.0),(HighsLogType)in_RDI,
              (char *)0x1,"    Sum                 = %8.2f\n\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x46),(HighsLogType)in_RDI,(char *)0x1,
              "    Time maxvol         = %8.2f\n");
  dVar1 = *(double *)(in_RSI + 0x46);
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x48),(HighsLogType)in_RDI,(char *)0x1,
              "    Time cr1            = %8.2f\n");
  dVar2 = *(double *)(in_RSI + 0x48);
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x4e),(HighsLogType)in_RDI,(char *)0x1,
              "    Time cr2            = %8.2f\n");
  highsLogDev((HighsLogOptions *)(*(double *)(in_RSI + 0x4e) + dVar2 + dVar1 + 0.0),
              (HighsLogType)in_RDI,(char *)0x1,"    Sum                 = %8.2f\n\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x4a),(HighsLogType)in_RDI,(char *)0x1,
              "    Time cr1_AAt        = %8.2f\n");
  dVar1 = *(double *)(in_RSI + 0x4a);
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x4c),(HighsLogType)in_RDI,(char *)0x1,
              "    Time cr1_pre        = %8.2f\n");
  highsLogDev((HighsLogOptions *)(*(double *)(in_RSI + 0x4c) + dVar1 + 0.0),(HighsLogType)in_RDI,
              (char *)0x1,"    Sum  cr1            = %8.2f\n\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x50),(HighsLogType)in_RDI,(char *)0x1,
              "    Time cr2_NNt        = %8.2f\n");
  dVar1 = *(double *)(in_RSI + 0x50);
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x52),(HighsLogType)in_RDI,(char *)0x1,
              "    Time cr2_B          = %8.2f\n");
  dVar2 = *(double *)(in_RSI + 0x52);
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x54),(HighsLogType)in_RDI,(char *)0x1,
              "    Time cr2_Bt         = %8.2f\n");
  highsLogDev((HighsLogOptions *)(*(double *)(in_RSI + 0x54) + dVar2 + dVar1 + 0.0),
              (HighsLogType)in_RDI,(char *)0x1,"    Sum  cr2            = %8.2f\n\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x56),(HighsLogType)in_RDI,(char *)0x1,
              "    Proportion of sparse FTRAN = %11.4g\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x58),(HighsLogType)in_RDI,(char *)0x1,
              "    Proportion of sparse BTRAN = %11.4g\n\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x5a),(HighsLogType)in_RDI,(char *)0x1,
              "    Time FTRAN       = %8.2f\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x5c),(HighsLogType)in_RDI,(char *)0x1,
              "    Time BTRAN       = %8.2f\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x5e),(HighsLogType)in_RDI,(char *)0x1,
              "    Time LU INVERT   = %8.2f\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x60),(HighsLogType)in_RDI,(char *)0x1,
              "    Time LU UPDATE   = %8.2f\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x62),(HighsLogType)in_RDI,(char *)0x1,
              "    Mean fill-in     = %11.4g\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 100),(HighsLogType)in_RDI,(char *)0x1,
              "    Max fill-in      = %11.4g\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x66),(HighsLogType)in_RDI,(char *)0x1,
              "    Time symb INVERT = %11.4g\n\n");
  highsLogDev(in_RDI,kInfo,"    Maxvol updates       = %d\n",(ulong)in_RSI[0x68]);
  highsLogDev(in_RDI,kInfo,"    Maxvol skipped       = %d\n",(ulong)in_RSI[0x69]);
  highsLogDev(in_RDI,kInfo,"    Maxvol passes        = %d\n",(ulong)in_RSI[0x6a]);
  highsLogDev(in_RDI,kInfo,"    Tableau num nonzeros = %d\n",(ulong)in_RSI[0x6b]);
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x6c),(HighsLogType)in_RDI,(char *)0x1,
              "    Tbl max?             = %11.4g\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x6e),(HighsLogType)in_RDI,(char *)0x1,
              "    Frobnorm squared     = %11.4g\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x70),(HighsLogType)in_RDI,(char *)0x1,
              "    Lambda max           = %11.4g\n");
  highsLogDev(*(HighsLogOptions **)(in_RSI + 0x72),(HighsLogType)in_RDI,(char *)0x1,
              "    Volume increase      = %11.4g\n\n");
  return;
}

Assistant:

void reportSolveData(const HighsLogOptions& log_options,
                     const ipx::Info& ipx_info) {
  highsLogDev(log_options, HighsLogType::kInfo, "\nIPX Solve data\n");
  highsLogDev(log_options, HighsLogType::kInfo, "    IPX       status = %4d\n",
              (int)ipx_info.status);
  highsLogDev(log_options, HighsLogType::kInfo, "    IPM       status = %4d\n",
              (int)ipx_info.status_ipm);
  highsLogDev(log_options, HighsLogType::kInfo, "    Crossover status = %4d\n",
              (int)ipx_info.status_crossover);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    IPX errflag      = %4d\n\n", (int)ipx_info.errflag);

  highsLogDev(log_options, HighsLogType::kInfo, "    LP variables   = %8d\n",
              (int)ipx_info.num_var);
  highsLogDev(log_options, HighsLogType::kInfo, "    LP constraints = %8d\n",
              (int)ipx_info.num_constr);
  highsLogDev(log_options, HighsLogType::kInfo, "    LP entries     = %8d\n\n",
              (int)ipx_info.num_entries);

  highsLogDev(log_options, HighsLogType::kInfo, "    Solver columns = %8d\n",
              (int)ipx_info.num_cols_solver);
  highsLogDev(log_options, HighsLogType::kInfo, "    Solver rows    = %8d\n",
              (int)ipx_info.num_rows_solver);
  highsLogDev(log_options, HighsLogType::kInfo, "    Solver entries = %8d\n\n",
              (int)ipx_info.num_entries_solver);

  highsLogDev(log_options, HighsLogType::kInfo, "    Dualized = %d\n",
              (int)ipx_info.dualized);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Number of dense columns detected = %d\n\n",
              (int)ipx_info.dense_cols);

  highsLogDev(log_options, HighsLogType::kInfo, "    Dependent rows    = %d\n",
              (int)ipx_info.dependent_rows);
  highsLogDev(log_options, HighsLogType::kInfo, "    Dependent cols    = %d\n",
              (int)ipx_info.dependent_cols);
  highsLogDev(log_options, HighsLogType::kInfo, "    Inconsistent rows = %d\n",
              (int)ipx_info.rows_inconsistent);
  highsLogDev(log_options, HighsLogType::kInfo, "    Inconsistent cols = %d\n",
              (int)ipx_info.cols_inconsistent);
  highsLogDev(log_options, HighsLogType::kInfo, "    Primal dropped    = %d\n",
              (int)ipx_info.primal_dropped);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Dual   dropped    = %d\n\n", (int)ipx_info.dual_dropped);

  highsLogDev(log_options, HighsLogType::kInfo,
              "    |Absolute primal residual| = %11.4g\n",
              ipx_info.abs_presidual);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    |Absolute   dual residual| = %11.4g\n",
              ipx_info.abs_dresidual);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    |Relative primal residual| = %11.4g\n",
              ipx_info.rel_presidual);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    |Relative   dual residual| = %11.4g\n\n",
              ipx_info.rel_dresidual);

  highsLogDev(log_options, HighsLogType::kInfo,
              "    Primal objective value     = %11.4g\n", ipx_info.pobjval);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Dual   objective value     = %11.4g\n", ipx_info.dobjval);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Relative objective gap     = %11.4g\n", ipx_info.rel_objgap);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Complementarity            = %11.4g\n\n",
              ipx_info.complementarity);

  highsLogDev(log_options, HighsLogType::kInfo, "    |x| = %11.4g\n",
              ipx_info.normx);
  highsLogDev(log_options, HighsLogType::kInfo, "    |y| = %11.4g\n",
              ipx_info.normy);
  highsLogDev(log_options, HighsLogType::kInfo, "    |z| = %11.4g\n\n",
              ipx_info.normz);

  highsLogDev(log_options, HighsLogType::kInfo,
              "    Objective value       = %11.4g\n", ipx_info.objval);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Primal infeasibility = %11.4g\n", ipx_info.primal_infeas);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Dual infeasibility   = %11.4g\n\n", ipx_info.dual_infeas);

  highsLogDev(log_options, HighsLogType::kInfo, "    IPM iter   = %d\n",
              (int)ipx_info.iter);
  highsLogDev(log_options, HighsLogType::kInfo, "    KKT iter 1 = %d\n",
              (int)ipx_info.kktiter1);
  highsLogDev(log_options, HighsLogType::kInfo, "    KKT iter 2 = %d\n",
              (int)ipx_info.kktiter2);
  highsLogDev(log_options, HighsLogType::kInfo, "    Basis repairs = %d\n",
              (int)ipx_info.basis_repairs);
  highsLogDev(log_options, HighsLogType::kInfo, "    Updates start     = %d\n",
              (int)ipx_info.updates_start);
  highsLogDev(log_options, HighsLogType::kInfo, "    Updates ipm       = %d\n",
              (int)ipx_info.updates_ipm);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Updates crossover = %d\n\n",
              (int)ipx_info.updates_crossover);

  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time total          = %8.2f\n\n", ipx_info.time_total);
  double sum_time = 0;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time IPM 1          = %8.2f\n", ipx_info.time_ipm1);
  sum_time += ipx_info.time_ipm1;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time IPM 2          = %8.2f\n", ipx_info.time_ipm2);
  sum_time += ipx_info.time_ipm2;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time starting basis = %8.2f\n",
              ipx_info.time_starting_basis);
  sum_time += ipx_info.time_starting_basis;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time crossover      = %8.2f\n", ipx_info.time_crossover);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Sum                 = %8.2f\n\n", sum_time);

  sum_time = 0;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time kkt_factorize  = %8.2f\n", ipx_info.time_kkt_factorize);
  sum_time += ipx_info.time_kkt_factorize;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time kkt_solve      = %8.2f\n", ipx_info.time_kkt_solve);
  sum_time += ipx_info.time_kkt_solve;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Sum                 = %8.2f\n\n", sum_time);

  sum_time = 0;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time maxvol         = %8.2f\n", ipx_info.time_maxvol);
  sum_time += ipx_info.time_maxvol;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time cr1            = %8.2f\n", ipx_info.time_cr1);
  sum_time += ipx_info.time_cr1;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time cr2            = %8.2f\n", ipx_info.time_cr2);
  sum_time += ipx_info.time_cr2;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Sum                 = %8.2f\n\n", sum_time);

  sum_time = 0;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time cr1_AAt        = %8.2f\n", ipx_info.time_cr1_AAt);
  sum_time += ipx_info.time_cr1_AAt;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time cr1_pre        = %8.2f\n", ipx_info.time_cr1_pre);
  sum_time += ipx_info.time_cr1_pre;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Sum  cr1            = %8.2f\n\n", sum_time);

  sum_time = 0;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time cr2_NNt        = %8.2f\n", ipx_info.time_cr2_NNt);
  sum_time += ipx_info.time_cr2_NNt;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time cr2_B          = %8.2f\n", ipx_info.time_cr2_B);
  sum_time += ipx_info.time_cr2_B;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time cr2_Bt         = %8.2f\n", ipx_info.time_cr2_Bt);
  sum_time += ipx_info.time_cr2_Bt;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Sum  cr2            = %8.2f\n\n", sum_time);

  highsLogDev(log_options, HighsLogType::kInfo,
              "    Proportion of sparse FTRAN = %11.4g\n",
              ipx_info.ftran_sparse);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Proportion of sparse BTRAN = %11.4g\n\n",
              ipx_info.btran_sparse);

  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time FTRAN       = %8.2f\n", ipx_info.time_ftran);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time BTRAN       = %8.2f\n", ipx_info.time_btran);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time LU INVERT   = %8.2f\n", ipx_info.time_lu_invert);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time LU UPDATE   = %8.2f\n", ipx_info.time_lu_update);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Mean fill-in     = %11.4g\n", ipx_info.mean_fill);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Max fill-in      = %11.4g\n", ipx_info.max_fill);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time symb INVERT = %11.4g\n\n", ipx_info.time_symb_invert);

  highsLogDev(log_options, HighsLogType::kInfo,
              "    Maxvol updates       = %d\n", (int)ipx_info.maxvol_updates);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Maxvol skipped       = %d\n", (int)ipx_info.maxvol_skipped);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Maxvol passes        = %d\n", (int)ipx_info.maxvol_passes);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Tableau num nonzeros = %d\n", (int)ipx_info.tbl_nnz);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Tbl max?             = %11.4g\n", ipx_info.tbl_max);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Frobnorm squared     = %11.4g\n", ipx_info.frobnorm_squared);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Lambda max           = %11.4g\n", ipx_info.lambdamax);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Volume increase      = %11.4g\n\n",
              ipx_info.volume_increase);
}